

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

int xmlSerializeHexCharRef(char *buf,int val)

{
  char cVar1;
  uint uVar2;
  uint local_28;
  int d;
  int bits;
  int shift;
  char *out;
  int val_local;
  char *buf_local;
  
  d = 0;
  *buf = '&';
  buf[1] = '#';
  _bits = buf + 3;
  buf[2] = 'x';
  if ((val & 0xff0000U) == 0) {
    local_28 = val;
    if ((val & 0xff00U) != 0) {
      d = 8;
      local_28 = val & 0xff00;
    }
  }
  else {
    d = 0x10;
    local_28 = val & 0xff0000;
  }
  if ((local_28 & 0xf0f0f0) != 0) {
    d = d + 4;
  }
  do {
    uVar2 = val >> ((byte)d & 0x1f) & 0xf;
    cVar1 = (char)uVar2;
    if (uVar2 < 10) {
      *_bits = cVar1 + '0';
    }
    else {
      *_bits = cVar1 + '7';
    }
    _bits = _bits + 1;
    d = d + -4;
  } while (-1 < d);
  *_bits = ';';
  return ((int)_bits + 1) - (int)buf;
}

Assistant:

int
xmlSerializeHexCharRef(char *buf, int val) {
    char *out = buf;
    int shift = 0, bits;

    *out++ = '&';
    *out++ = '#';
    *out++ = 'x';

    bits = val;
    if (bits & 0xFF0000) {
        shift = 16;
        bits &= 0xFF0000;
    } else if (bits & 0x00FF00) {
        shift = 8;
        bits &= 0x00FF00;
    }
    if (bits & 0xF0F0F0) {
        shift += 4;
    }

    do {
        int d = (val >> shift) & 0x0F;

        if (d < 10)
            *out++ = '0' + d;
        else
            *out++ = 'A' + (d - 10);

	shift -= 4;
    } while (shift >= 0);

    *out++ = ';';

    return(out - buf);
}